

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffextn(char *url,int *extension_num,int *status)

{
  int iVar1;
  char *pcVar2;
  fitsfile *in_RDX;
  int *in_RSI;
  char *in_RDI;
  int tstatus;
  int hdutype;
  int extvers;
  int extnum;
  char *cptr;
  char rowexpress [1025];
  char imagecolname [71];
  char colspec [1025];
  char binspec [1025];
  char rowfilter [1025];
  char extname [1025];
  char extspec [1025];
  char outfile [1025];
  char infile [1025];
  char urltype [20];
  fitsfile *fptr;
  fitsfile *status_00;
  int local_2124;
  char *in_stack_ffffffffffffdee0;
  char *in_stack_ffffffffffffdee8;
  char *in_stack_ffffffffffffdef0;
  char *in_stack_ffffffffffffdef8;
  char *in_stack_ffffffffffffdf00;
  char *in_stack_ffffffffffffdf08;
  char *in_stack_ffffffffffffdf20;
  char *in_stack_ffffffffffffdf28;
  int *in_stack_ffffffffffffdf30;
  int *in_stack_ffffffffffffdf38;
  int *in_stack_ffffffffffffdf40;
  char *in_stack_ffffffffffffdf48;
  int *in_stack_ffffffffffffdf50;
  char *in_stack_ffffffffffffdf58;
  char *in_stack_ffffffffffffdf70;
  int *in_stack_ffffffffffffdf78;
  char local_1d08;
  char local_18a8;
  char local_1088;
  char local_c78;
  char local_458 [1040];
  char local_48 [32];
  fitsfile *local_28;
  fitsfile *local_20;
  int *local_18;
  char *local_10;
  int local_4;
  
  if (in_RDX->HDUposition < 1) {
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    ffiurl(in_stack_ffffffffffffdf08,in_stack_ffffffffffffdf00,in_stack_ffffffffffffdef8,
           in_stack_ffffffffffffdef0,in_stack_ffffffffffffdee8,in_stack_ffffffffffffdee0,
           in_stack_ffffffffffffdf20,in_stack_ffffffffffffdf28,in_stack_ffffffffffffdf30);
    if (local_20->HDUposition < 1) {
      if (local_18a8 == '\0') {
        if (local_c78 == '\0') {
          *local_18 = -99;
          local_4 = local_20->HDUposition;
        }
        else {
          status_00 = local_20;
          ffexts(in_stack_ffffffffffffdf58,in_stack_ffffffffffffdf50,in_stack_ffffffffffffdf48,
                 in_stack_ffffffffffffdf40,in_stack_ffffffffffffdf38,
                 (char *)in_stack_ffffffffffffdf30,in_stack_ffffffffffffdf70,
                 in_stack_ffffffffffffdf78);
          if (local_20->HDUposition < 1) {
            if (local_1d08 == '\0') {
              if (local_1088 == '\0') {
                *local_18 = local_2124 + 1;
                local_4 = local_20->HDUposition;
              }
              else {
                iVar1 = strcmp(local_48,"stdin://");
                if (iVar1 == 0) {
                  local_20->HDUposition = 0x7d;
                  local_4 = 0x7d;
                }
                else {
                  local_458[0] = '\0';
                  strncat(local_458,local_10,0x400);
                  pcVar2 = strchr(local_458,0x5d);
                  if (pcVar2 == (char *)0x0) {
                    local_20->HDUposition = 0x7d;
                    local_4 = 0x7d;
                  }
                  else {
                    pcVar2[1] = '\0';
                    iVar1 = ffopen((fitsfile **)extname._808_8_,(char *)extname._800_8_,
                                   extname._796_4_,(int *)extname._784_8_);
                    if (iVar1 < 1) {
                      ffghdn(local_28,&local_2124);
                      *local_18 = local_2124;
                      ffclos(in_RDX,&status_00->HDUposition);
                      local_4 = local_20->HDUposition;
                    }
                    else {
                      ffclos(in_RDX,&status_00->HDUposition);
                      local_4 = local_20->HDUposition;
                    }
                  }
                }
              }
            }
            else {
              *local_18 = 1;
              local_4 = local_20->HDUposition;
            }
          }
          else {
            local_4 = local_20->HDUposition;
          }
        }
      }
      else {
        *local_18 = 1;
        local_4 = local_20->HDUposition;
      }
    }
    else {
      local_4 = local_20->HDUposition;
    }
  }
  else {
    local_4 = in_RDX->HDUposition;
  }
  return local_4;
}

Assistant:

int ffextn(char *url,           /* I - input filename/URL  */
           int *extension_num,  /* O - returned extension number */
           int *status)
{
/*
   Parse the input url string and return the number of the extension that
   CFITSIO would automatically move to if CFITSIO were to open this input URL.
   The extension numbers are one's based, so 1 = the primary array, 2 = the
   first extension, etc.

   The extension number that gets returned is determined by the following 
   algorithm:

   1. If the input URL includes a binning specification (e.g.
   'myfile.fits[3][bin X,Y]') then the returned extension number
   will always = 1, since CFITSIO would create a temporary primary
   image on the fly in this case.  The same is true if an image
   within a single cell of a binary table is opened.

   2.  Else if the input URL specifies an extension number (e.g.,
   'myfile.fits[3]' or 'myfile.fits+3') then the specified extension
   number (+ 1) is returned.  

   3.  Else if the extension name is specified in brackets
   (e.g., this 'myfile.fits[EVENTS]') then the file will be opened and searched
   for the extension number.  If the input URL is '-'  (reading from the stdin
   file stream) this is not possible and an error will be returned.

   4.  Else if the URL does not specify an extension (e.g. 'myfile.fits') then
   a special extension number = -99 will be returned to signal that no
   extension was specified.  This feature is mainly for compatibility with
   existing FTOOLS software.  CFITSIO would open the primary array by default
   (extension_num = 1) in this case.

*/
    fitsfile *fptr;
    char urltype[20];
    char infile[FLEN_FILENAME];
    char outfile[FLEN_FILENAME]; 
    char extspec[FLEN_FILENAME];
    char extname[FLEN_FILENAME];
    char rowfilter[FLEN_FILENAME];
    char binspec[FLEN_FILENAME];
    char colspec[FLEN_FILENAME];
    char imagecolname[FLEN_VALUE], rowexpress[FLEN_FILENAME];
    char *cptr;
    int extnum, extvers, hdutype, tstatus = 0;

    if (*status > 0)
        return(*status);

    /*  parse the input URL into its basic components  */
    fits_parse_input_url(url, urltype, infile, outfile,
             extspec, rowfilter,binspec, colspec, status);

    if (*status > 0)
        return(*status);

    if (*binspec)   /* is there a binning specification? */
    {
       *extension_num = 1; /* a temporary primary array image is created */
       return(*status);
    }

    if (*extspec)   /* is an extension specified? */
    {
       ffexts(extspec, &extnum, 
         extname, &extvers, &hdutype, imagecolname, rowexpress, status);

      if (*status > 0)
        return(*status);

      if (*imagecolname)   /* is an image within a table cell being opened? */
      {
         *extension_num = 1; /* a temporary primary array image is created */
         return(*status);
      }

      if (*extname)
      {
         /* have to open the file to search for the extension name (curses!) */

         if (!strcmp(urltype, "stdin://"))
            /* opening stdin would destroying it! */
            return(*status = URL_PARSE_ERROR); 

         /* First, strip off any filtering specification */
         infile[0] = '\0';
	 strncat(infile, url, FLEN_FILENAME -1);
	 
         cptr = strchr(infile, ']');  /* locate the closing bracket */
         if (!cptr)
         {
             return(*status = URL_PARSE_ERROR);
         }
         else
         {
             cptr++;
             *cptr = '\0'; /* terminate URl after the extension spec */
         }

         if (ffopen(&fptr, infile, READONLY, status) > 0) /* open the file */
         {
            ffclos(fptr, &tstatus);
            return(*status);
         }

         ffghdn(fptr, &extnum);    /* where am I in the file? */
         *extension_num = extnum;
         ffclos(fptr, status);

         return(*status);
      }
      else
      {
         *extension_num = extnum + 1;  /* return the specified number (+ 1) */
         return(*status);
      }
    }
    else
    {
         *extension_num = -99;  /* no specific extension was specified */
                                /* defaults to primary array */
         return(*status);
    }
}